

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O2

bool __thiscall
gnuplotio::
PairOfRange<gnuplotio::IteratorRange<const_int_*,_int>,_gnuplotio::IteratorRange<const_int_*,_int>_>
::is_end(PairOfRange<gnuplotio::IteratorRange<const_int_*,_int>,_gnuplotio::IteratorRange<const_int_*,_int>_>
         *this)

{
  int *piVar1;
  int *piVar2;
  length_error *this_00;
  
  piVar1 = (this->l).it;
  piVar2 = (this->l).end;
  if ((piVar1 == piVar2) == ((this->r).it == (this->r).end)) {
    return piVar1 == piVar2;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"columns were different lengths");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

bool is_end() const { return it == end; }